

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O0

void __thiscall ProcessEstimator::collect(ProcessEstimator *this)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  ProcessEstimator *this_local;
  
  if (this->nCurrent < this->nLength) {
    if (((this->super_Estimator).nEstimate & 0x40U) == 0) {
      (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[8])();
      this->aSample[this->nCurrent] = extraout_XMM0_Qa_00;
    }
    else {
      (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[7])();
      this->aSample[this->nCurrent] = extraout_XMM0_Qa;
    }
    this->nCurrent = this->nCurrent + 1;
  }
  return;
}

Assistant:

void ProcessEstimator::collect()
{
	// eat next data point, without stepping stoch. variable
	if(nCurrent < nLength) {
		if( nEstimate & EST_DIFF )
			aSample[nCurrent] = pSource->getIncrement();
		else
			aSample[nCurrent] = pSource->getCurrentValue();
		++nCurrent;
	}
}